

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

int fctcl__is_option(fctcl_t *clo,char *option)

{
  int iVar1;
  
  if (clo == (fctcl_t *)0x0) {
    __assert_fail("clo != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x5f0
                  ,"int fctcl__is_option(const fctcl_t *, const char *)");
  }
  if (option != (char *)0x0) {
    if ((clo->long_opt != (char *)0x0) && (iVar1 = fctstr_eq(clo->long_opt,option), iVar1 != 0)) {
      return 1;
    }
    if (clo->short_opt != (char *)0x0) {
      iVar1 = fctstr_eq(clo->short_opt,option);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

static int
fctcl__is_option(fctcl_t const *clo, char const *option)
{
    FCT_ASSERT( clo != NULL );
    if ( option == NULL )
    {
        return 0;
    }
    return ((clo->long_opt != NULL
             && fctstr_eq(clo->long_opt, option))
            ||
            (clo->short_opt != NULL
             && fctstr_eq(clo->short_opt, option))
           );
}